

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcWindow::IfcWindow(IfcWindow *this)

{
  IfcWindow *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x178,"IfcWindow");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00f637b0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>,
             &PTR_construction_vtable_24__00f638e8);
  *(undefined8 *)this = 0xf63680;
  *(undefined8 *)&this->field_0x178 = 0xf63798;
  *(undefined8 *)&this->field_0x88 = 0xf636a8;
  *(undefined8 *)&this->field_0x98 = 0xf636d0;
  *(undefined8 *)&this->field_0xd0 = 0xf636f8;
  *(undefined8 *)&this->field_0x100 = 0xf63720;
  *(undefined8 *)&this->field_0x138 = 0xf63748;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>)._vptr_ObjectHelper =
       (_func_int **)0xf63770;
  STEP::Maybe<double>::Maybe
            ((Maybe<double> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>).field_0x10);
  STEP::Maybe<double>::Maybe
            ((Maybe<double> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWindow,_2UL>).field_0x20);
  return;
}

Assistant:

IfcWindow() : Object("IfcWindow") {}